

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

int Am_Font_Data::remove(char *__filename)

{
  Am_Font_Data *local_20;
  Am_Font_Data *curr;
  Am_Font_Data *prev;
  Am_Font_Data *font_local;
  
  curr = (Am_Font_Data *)0x0;
  local_20 = list;
  while( true ) {
    if (local_20 == (Am_Font_Data *)0x0) {
      return (int)local_20;
    }
    if (local_20 == (Am_Font_Data *)__filename) break;
    curr = local_20;
    local_20 = local_20->next;
  }
  if (curr == (Am_Font_Data *)0x0) {
    list = local_20->next;
    curr = (Am_Font_Data *)&list;
  }
  else {
    curr->next = local_20->next;
  }
  return (int)curr;
}

Assistant:

void
Am_Font_Data::remove(Am_Font_Data *font)
{
  Am_Font_Data *prev = nullptr;
  Am_Font_Data *curr = list;
  while (curr) {
    if (curr == font) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}